

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

vec3 __thiscall vera::Triangle::getClosestPoint(Triangle *this,vec3 *_p)

{
  float *pfVar1;
  vec3 *v2;
  vec<3,_float,_(glm::qualifier)0> *pvVar2;
  float fVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec3 vVar5;
  undefined8 local_320;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_318;
  vec<3,_float,_(glm::qualifier)0> local_310;
  vec<3,_float,_(glm::qualifier)0> local_300;
  vec<3,_float,_(glm::qualifier)0> local_2f0;
  vec<3,_float,_(glm::qualifier)0> local_2e0;
  vec<3,_float,_(glm::qualifier)0> local_2d0;
  vec<3,_float,_(glm::qualifier)0> local_2c0;
  vec<3,_float,_(glm::qualifier)0> local_2b0;
  vec<3,_float,_(glm::qualifier)0> local_2a0;
  undefined8 local_290;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_288;
  vec<3,_float,_(glm::qualifier)0> local_280;
  vec<3,_float,_(glm::qualifier)0> local_270;
  vec<3,_float,_(glm::qualifier)0> local_260;
  vec<3,_float,_(glm::qualifier)0> local_250;
  float local_240;
  float local_23c;
  float t_2;
  float n_2;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_230;
  vec<3,_float,_(glm::qualifier)0> local_228;
  vec<3,_float,_(glm::qualifier)0> local_218;
  vec<3,_float,_(glm::qualifier)0> local_208;
  vec<3,_float,_(glm::qualifier)0> local_1f8;
  float local_1e8;
  float local_1e4;
  float t_1;
  float n_1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1d8;
  undefined1 local_1d0 [8];
  vec3 ca;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1b8;
  vec<3,_float,_(glm::qualifier)0> local_1b0;
  vec<3,_float,_(glm::qualifier)0> local_1a0;
  vec<3,_float,_(glm::qualifier)0> local_190;
  vec<3,_float,_(glm::qualifier)0> local_180;
  float local_170;
  float local_16c;
  float t;
  float n;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_160;
  undefined1 local_158 [8];
  vec3 bc;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_144;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_140;
  undefined1 local_134 [8];
  vec3 bcoords;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_120;
  undefined1 local_118 [8];
  vec3 ap;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_104;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_100;
  vec<3,_float,_(glm::qualifier)0> local_f8;
  vec<3,_float,_(glm::qualifier)0> local_e8;
  vec<3,_float,_(glm::qualifier)0> local_d8;
  vec<3,_float,_(glm::qualifier)0> local_c8;
  undefined1 local_b8 [8];
  vec3 p;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_a4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_a0;
  vec<3,_float,_(glm::qualifier)0> local_98;
  vec<3,_float,_(glm::qualifier)0> local_88;
  undefined1 local_78 [8];
  vec3 normal;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_64;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_60;
  undefined1 local_58 [8];
  vec3 ac;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_44;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_40;
  undefined1 local_38 [8];
  vec3 ab;
  vec3 *_p_local;
  Triangle *this_local;
  undefined4 uStack_10;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c;
  
  v2 = this->m_vertices;
  unique0x100005bb = _p;
  vVar4 = glm::operator-(this->m_vertices + 1,v2);
  local_40 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
  ab.field_0 = local_40;
  stack0xffffffffffffffb8 = vVar4._0_8_;
  local_38._0_4_ = ac.field_2;
  local_38._4_4_ = aStack_44;
  unique0x100005af = vVar4;
  vVar4 = glm::operator-(this->m_vertices + 2,v2);
  local_60 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
  ac.field_0 = local_60;
  stack0xffffffffffffff98 = vVar4._0_8_;
  local_58._0_4_ = normal.field_2;
  local_58._4_4_ = aStack_64;
  unique0x100005a3 = vVar4;
  vVar4 = glm::cross<float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)local_58,
                     (vec<3,_float,_(glm::qualifier)0> *)local_38);
  local_98.field_2 = vVar4.field_2;
  local_88.field_2 = local_98.field_2;
  local_98._0_8_ = vVar4._0_8_;
  local_88.field_0 = local_98.field_0;
  local_88.field_1 = local_98.field_1;
  vVar4 = glm::normalize<3,float,(glm::qualifier)0>(&local_88);
  pvVar2 = stack0xffffffffffffffd8;
  local_a0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
  normal.field_0 = local_a0;
  stack0xffffffffffffff58 = vVar4._0_8_;
  local_78._0_4_ = p.field_2;
  local_78._4_4_ = aStack_a4;
  unique0x10000597 = vVar4;
  vVar4 = glm::operator-(stack0xffffffffffffffd8,v2);
  local_e8.field_2 = vVar4.field_2;
  local_d8.field_2 = local_e8.field_2;
  local_e8._0_8_ = vVar4._0_8_;
  local_d8.field_0 = local_e8.field_0;
  local_d8.field_1 = local_e8.field_1;
  fVar3 = glm::dot<3,float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)local_78,&local_d8);
  vVar4 = glm::operator*(fVar3,(vec<3,_float,_(glm::qualifier)0> *)local_78);
  local_f8.field_2 = vVar4.field_2;
  local_c8.field_2 = local_f8.field_2;
  local_f8._0_8_ = vVar4._0_8_;
  local_c8.field_0 = local_f8.field_0;
  local_c8.field_1 = local_f8.field_1;
  vVar4 = glm::operator-(pvVar2,&local_c8);
  local_100 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
  p.field_0 = local_100;
  stack0xfffffffffffffef8 = vVar4._0_8_;
  local_b8._0_4_ = ap.field_2;
  local_b8._4_4_ = aStack_104;
  unique0x1000058b = vVar4;
  vVar4 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_b8,v2);
  local_120 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
  ap.field_0 = local_120;
  bcoords._4_8_ = vVar4._0_8_;
  local_118._0_4_ = bcoords.field_1;
  local_118._4_4_ = bcoords.field_2;
  unique0x1000057f = vVar4;
  vVar5 = getBarycentric((vec<3,_float,_(glm::qualifier)0> *)local_38,
                         (vec<3,_float,_(glm::qualifier)0> *)local_58,(vec3 *)local_118);
  stack0xfffffffffffffeb8 = vVar5._0_8_;
  local_134._0_4_ = bc.field_2;
  local_134._4_4_ = aStack_144;
  local_140 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar5.field_2;
  bcoords.field_0 = local_140;
  unique0x10000573 = vVar5;
  pfVar1 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)local_134,0);
  if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
    pfVar1 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                       ((vec<3,_float,_(glm::qualifier)0> *)local_134,1);
    if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
      pfVar1 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_134,2);
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        pfVar1 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                           ((vec<3,_float,_(glm::qualifier)0> *)local_134,0);
        vVar4 = glm::operator*(this->m_vertices,*pfVar1);
        local_2c0.field_2 = vVar4.field_2;
        local_2b0.field_2 = local_2c0.field_2;
        local_2c0._0_8_ = vVar4._0_8_;
        local_2b0.field_0 = local_2c0.field_0;
        local_2b0.field_1 = local_2c0.field_1;
        local_2c0 = vVar4;
        pfVar1 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                           ((vec<3,_float,_(glm::qualifier)0> *)local_134,1);
        vVar4 = glm::operator*(this->m_vertices + 1,*pfVar1);
        local_2e0.field_2 = vVar4.field_2;
        local_2d0.field_2 = local_2e0.field_2;
        local_2e0._0_8_ = vVar4._0_8_;
        local_2d0.field_0 = local_2e0.field_0;
        local_2d0.field_1 = local_2e0.field_1;
        local_2e0 = vVar4;
        vVar4 = glm::operator+(&local_2b0,&local_2d0);
        local_2f0.field_2 = vVar4.field_2;
        local_2a0.field_2 = local_2f0.field_2;
        local_2f0._0_8_ = vVar4._0_8_;
        local_2a0.field_0 = local_2f0.field_0;
        local_2a0.field_1 = local_2f0.field_1;
        local_2f0 = vVar4;
        pfVar1 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                           ((vec<3,_float,_(glm::qualifier)0> *)local_134,2);
        vVar4 = glm::operator*(this->m_vertices + 2,*pfVar1);
        local_310.field_2 = vVar4.field_2;
        local_300.field_2 = local_310.field_2;
        local_310._0_8_ = vVar4._0_8_;
        local_300.field_0 = local_310.field_0;
        local_300.field_1 = local_310.field_1;
        vVar4 = glm::operator+(&local_2a0,&local_300);
        local_320 = vVar4._0_8_;
        stack0xffffffffffffffec = local_320;
        local_318 = vVar4.field_2;
        local_c = local_318;
      }
      else {
        local_23c = glm::length<3,float,(glm::qualifier)0>
                              ((vec<3,_float,_(glm::qualifier)0> *)local_38);
        vVar4 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_b8,this->m_vertices);
        local_260.field_2 = vVar4.field_2;
        local_250.field_2 = local_260.field_2;
        local_260._0_8_ = vVar4._0_8_;
        local_250.field_0 = local_260.field_0;
        local_250.field_1 = local_260.field_1;
        local_260 = vVar4;
        fVar3 = glm::dot<3,float,(glm::qualifier)0>
                          ((vec<3,_float,_(glm::qualifier)0> *)local_38,&local_250);
        fVar3 = glm::min<float>(fVar3 / local_23c,local_23c);
        local_240 = glm::max<float>(0.0,fVar3);
        vVar4 = glm::operator*(local_240 / local_23c,(vec<3,_float,_(glm::qualifier)0> *)local_38);
        local_280.field_2 = vVar4.field_2;
        local_270.field_2 = local_280.field_2;
        local_280._0_8_ = vVar4._0_8_;
        local_270.field_0 = local_280.field_0;
        local_270.field_1 = local_280.field_1;
        local_280 = vVar4;
        vVar4 = glm::operator+(this->m_vertices,&local_270);
        local_290 = vVar4._0_8_;
        stack0xffffffffffffffec = local_290;
        local_288 = vVar4.field_2;
        local_c = local_288;
      }
    }
    else {
      pvVar2 = this->m_vertices + 2;
      vVar4 = glm::operator-(this->m_vertices,pvVar2);
      local_1d8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
      ca.field_0 = local_1d8;
      _t_1 = vVar4._0_8_;
      local_1d0._0_4_ = t_1;
      local_1d0._4_4_ = n_1;
      _t_1 = vVar4;
      local_1e4 = glm::length<3,float,(glm::qualifier)0>
                            ((vec<3,_float,_(glm::qualifier)0> *)local_1d0);
      vVar4 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_b8,pvVar2);
      local_208.field_2 = vVar4.field_2;
      local_1f8.field_2 = local_208.field_2;
      local_208._0_8_ = vVar4._0_8_;
      local_1f8.field_0 = local_208.field_0;
      local_1f8.field_1 = local_208.field_1;
      local_208 = vVar4;
      fVar3 = glm::dot<3,float,(glm::qualifier)0>
                        ((vec<3,_float,_(glm::qualifier)0> *)local_1d0,&local_1f8);
      fVar3 = glm::min<float>(fVar3 / local_1e4,local_1e4);
      local_1e8 = glm::max<float>(0.0,fVar3);
      vVar4 = glm::operator*(local_1e8 / local_1e4,(vec<3,_float,_(glm::qualifier)0> *)local_1d0);
      local_228.field_2 = vVar4.field_2;
      local_218.field_2 = local_228.field_2;
      local_228._0_8_ = vVar4._0_8_;
      local_218.field_0 = local_228.field_0;
      local_218.field_1 = local_228.field_1;
      local_228 = vVar4;
      vVar4 = glm::operator+(pvVar2,&local_218);
      _t_2 = vVar4._0_8_;
      stack0xffffffffffffffec = _t_2;
      local_230 = vVar4.field_2;
      local_c = local_230;
    }
  }
  else {
    pvVar2 = this->m_vertices + 1;
    vVar4 = glm::operator-(this->m_vertices + 2,pvVar2);
    local_160 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar4.field_2;
    bc.field_0 = local_160;
    _t = vVar4._0_8_;
    local_158._0_4_ = t;
    local_158._4_4_ = n;
    _t = vVar4;
    local_16c = glm::length<3,float,(glm::qualifier)0>
                          ((vec<3,_float,_(glm::qualifier)0> *)local_158);
    vVar4 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)local_b8,pvVar2);
    local_190.field_2 = vVar4.field_2;
    local_180.field_2 = local_190.field_2;
    local_190._0_8_ = vVar4._0_8_;
    local_180.field_0 = local_190.field_0;
    local_180.field_1 = local_190.field_1;
    local_190 = vVar4;
    fVar3 = glm::dot<3,float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)local_158,&local_180);
    fVar3 = glm::min<float>(fVar3 / local_16c,local_16c);
    local_170 = glm::max<float>(0.0,fVar3);
    vVar4 = glm::operator*(local_170 / local_16c,(vec<3,_float,_(glm::qualifier)0> *)local_158);
    local_1b0.field_2 = vVar4.field_2;
    local_1a0.field_2 = local_1b0.field_2;
    local_1b0._0_8_ = vVar4._0_8_;
    local_1a0.field_0 = local_1b0.field_0;
    local_1a0.field_1 = local_1b0.field_1;
    vVar4 = glm::operator+(pvVar2,&local_1a0);
    stack0xfffffffffffffe40 = vVar4._0_8_;
    stack0xffffffffffffffec = stack0xfffffffffffffe40;
    local_1b8 = vVar4.field_2;
    local_c = local_1b8;
  }
  vVar5.field_2 = local_c;
  vVar5.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)this_local._4_4_;
  vVar5.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uStack_10;
  return vVar5;
}

Assistant:

glm::vec3 Triangle::getClosestPoint(const glm::vec3& _p) const {
    // https://github.com/nmoehrle/libacc/blob/master/primitives.h#L71
    glm::vec3 ab = m_vertices[1] - m_vertices[0];
    glm::vec3 ac = m_vertices[2] - m_vertices[0];
    glm::vec3 normal = glm::normalize( glm::cross(ac,ab) );

    glm::vec3 p = _p - glm::dot(normal, _p - m_vertices[0]) * normal;
    glm::vec3 ap = p - m_vertices[0];

    glm::vec3 bcoords = getBarycentric(ab, ac, ap);

    if (bcoords[0] < 0.0f) {
        glm::vec3 bc = m_vertices[2] - m_vertices[1];
        float n = glm::length( bc ); // bc.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(bc, p - m_vertices[1]) / n, n));
        return m_vertices[1] + t / n * bc;
    }

    if (bcoords[1] < 0.0f) {
        glm::vec3 ca = m_vertices[0] - m_vertices[2];
        float n = glm::length( ca ); //ca.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(ca, p - m_vertices[2]) / n, n));
        return m_vertices[2] + t / n * ca;
    }

    if (bcoords[2] < 0.0f) {
        //glm::vec3 ab = m_vertices[1] - m_vertices[0];
        float n = glm::length( ab ); //ab.norm();
        
        float t = glm::max(0.0f, glm::min( glm::dot(ab, p - m_vertices[0]) / n, n));
        return m_vertices[0] + t / n * ab;
    }

    return (m_vertices[0] * bcoords[0] + m_vertices[1] * bcoords[1] + m_vertices[2] * bcoords[2]);
}